

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase257::run(TestCase257 *this)

{
  Builder builder_00;
  Builder value;
  Builder value_00;
  Builder value_01;
  Builder value_02;
  bool bVar1;
  Array<char> local_240;
  Builder root;
  undefined1 in_stack_fffffffffffffe10 [40];
  undefined8 in_stack_fffffffffffffe38;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  value.builder.dataSize = (int)in_stack_fffffffffffffe38;
  value.builder.pointerCount = (short)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  value.builder._38_2_ = (short)((ulong)in_stack_fffffffffffffe38 >> 0x30);
  value.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffe10._0_8_;
  value.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffe10._8_8_;
  value.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffe10._16_8_;
  value.builder.data = (void *)in_stack_fffffffffffffe10._24_8_;
  value.builder.pointers = (WirePointer *)in_stack_fffffffffffffe10._32_8_;
  prettyPrint(value);
  kj::StringTree::flatten((String *)&local_240,(StringTree *)&stack0xfffffffffffffe00);
  bVar1 = kj::operator==("( voidField = void,\n  boolField = false,\n  int8Field = 0,\n  int16Field = 0,\n  int32Field = 0,\n  int64Field = 0,\n  uInt8Field = 0,\n  uInt16Field = 0,\n  uInt32Field = 0,\n  uInt64Field = 0,\n  float32Field = 0,\n  float64Field = 0,\n  enumField = foo,\n  interfaceField = void )"
                         ,(String *)&local_240);
  kj::Array<char>::~Array(&local_240);
  kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffe00);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    value_00.builder.dataSize = (int)in_stack_fffffffffffffe38;
    value_00.builder.pointerCount = (short)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    value_00.builder._38_2_ = (short)((ulong)in_stack_fffffffffffffe38 >> 0x30);
    value_00.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffe10._0_8_;
    value_00.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffe10._8_8_;
    value_00.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffe10._16_8_;
    value_00.builder.data = (void *)in_stack_fffffffffffffe10._24_8_;
    value_00.builder.pointers = (WirePointer *)in_stack_fffffffffffffe10._32_8_;
    prettyPrint(value_00);
    kj::StringTree::flatten((String *)&local_240,(StringTree *)&stack0xfffffffffffffe00);
    kj::_::Debug::log<char_const(&)[378],char_const(&)[272],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x113,ERROR,
               "\"failed: expected \" \"(\\\"( voidField = void,\\\\n\\\" \\\"  boolField = false,\\\\n\\\" \\\"  int8Field = 0,\\\\n\\\" \\\"  int16Field = 0,\\\\n\\\" \\\"  int32Field = 0,\\\\n\\\" \\\"  int64Field = 0,\\\\n\\\" \\\"  uInt8Field = 0,\\\\n\\\" \\\"  uInt16Field = 0,\\\\n\\\" \\\"  uInt32Field = 0,\\\\n\\\" \\\"  uInt64Field = 0,\\\\n\\\" \\\"  float32Field = 0,\\\\n\\\" \\\"  float64Field = 0,\\\\n\\\" \\\"  enumField = foo,\\\\n\\\" \\\"  interfaceField = void )\\\") == (prettyPrint(root).flatten())\", \"( voidField = void,\\n\" \"  boolField = false,\\n\" \"  int8Field = 0,\\n\" \"  int16Field = 0,\\n\" \"  int32Field = 0,\\n\" \"  int64Field = 0,\\n\" \"  uInt8Field = 0,\\n\" \"  uInt16Field = 0,\\n\" \"  uInt32Field = 0,\\n\" \"  uInt64Field = 0,\\n\" \"  float32Field = 0,\\n\" \"  float64Field = 0,\\n\" \"  enumField = foo,\\n\" \"  interfaceField = void )\", prettyPrint(root).flatten()"
               ,(char (*) [378])
                "failed: expected (\"( voidField = void,\\n\" \"  boolField = false,\\n\" \"  int8Field = 0,\\n\" \"  int16Field = 0,\\n\" \"  int32Field = 0,\\n\" \"  int64Field = 0,\\n\" \"  uInt8Field = 0,\\n\" \"  uInt16Field = 0,\\n\" \"  uInt32Field = 0,\\n\" \"  uInt64Field = 0,\\n\" \"  float32Field = 0,\\n\" \"  float64Field = 0,\\n\" \"  enumField = foo,\\n\" \"  interfaceField = void )\") == (prettyPrint(root).flatten())"
               ,(char (*) [272])
                "( voidField = void,\n  boolField = false,\n  int8Field = 0,\n  int16Field = 0,\n  int32Field = 0,\n  int64Field = 0,\n  uInt8Field = 0,\n  uInt16Field = 0,\n  uInt32Field = 0,\n  uInt64Field = 0,\n  float32Field = 0,\n  float64Field = 0,\n  enumField = foo,\n  interfaceField = void )"
               ,(String *)&local_240);
    kj::Array<char>::~Array(&local_240);
    kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffe00);
  }
  builder_00._builder.capTable = root._builder.capTable;
  builder_00._builder.segment = root._builder.segment;
  builder_00._builder.data = root._builder.data;
  builder_00._builder.pointers = root._builder.pointers;
  builder_00._builder.dataSize = root._builder.dataSize;
  builder_00._builder.pointerCount = root._builder.pointerCount;
  builder_00._builder._38_2_ = root._builder._38_2_;
  initTestMessage(builder_00);
  value_01.builder.dataSize = (int)in_stack_fffffffffffffe38;
  value_01.builder.pointerCount = (short)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  value_01.builder._38_2_ = (short)((ulong)in_stack_fffffffffffffe38 >> 0x30);
  value_01.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffe10._0_8_;
  value_01.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffe10._8_8_;
  value_01.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffe10._16_8_;
  value_01.builder.data = (void *)in_stack_fffffffffffffe10._24_8_;
  value_01.builder.pointers = (WirePointer *)in_stack_fffffffffffffe10._32_8_;
  prettyPrint(value_01);
  kj::StringTree::flatten((String *)&local_240,(StringTree *)&stack0xfffffffffffffe00);
  bVar1 = kj::operator==("( voidField = void,\n  boolField = true,\n  int8Field = -123,\n  int16Field = -12345,\n  int32Field = -12345678,\n  int64Field = -123456789012345,\n  uInt8Field = 234,\n  uInt16Field = 45678,\n  uInt32Field = 3456789012,\n  uInt64Field = 12345678901234567890,\n  float32Field = 1234.5,\n  float64Field = -1.23e47,\n  textField = \"foo\",\n  dataField = \"bar\",\n  structField = (\n    voidField = void,\n    boolField = true,\n    int8Field = -12,\n    int16Field = 3456,\n    int32Field = -78901234,\n    int64Field = 56789012345678,\n    uInt8Field = 90,\n    uInt16Field = 1234,\n    uInt32Field = 56789012,\n    uInt64Field = 345678901234567890,\n    float32Field = -1.25e-10,\n    float64Field = 345,\n    textField = \"baz\",\n    dataField = \"qux\",\n    structField = (\n      voidField = void,\n      boolField = false,\n      int8Field = 0,\n      int16Field = 0,\n      int32Field = 0,\n      int64Field = 0,\n      uInt8Field = 0,\n      uInt16Field = 0,\n      uInt32Field = 0,\n      uInt64Field = 0,\n      float32Field = 0,\n      float64Field = 0,\n      textField = \"nested\",\n      structField = (\n        voidField = void,\n        boolField = false,\n        int8Field = 0,\n        int16Field = 0,\n        int32Field = 0,\n        int64Field = 0,\n        uInt8Field = 0,\n        uInt16Field = 0,\n        uInt32Field = 0,\n        uInt64Field = 0,\n        float32Field = 0,\n        float64Field = 0,\n        textField = \"really nested\",\n        enumField = foo,\n        interfaceField = void ),\n      enumField = foo,\n      interfaceField = void ),\n    enumField = baz,\n    interfaceField = void,\n    voidList = [void, void, void],\n    boolList = [false, true, false, true, true],\n    int8List = [12, -34, -128, 127],\n    int16List = [1234, -5678, -32768, 32767],\n    int32List = [12345678, -90123456, -2147483648, 2147483647],\n    int64List = [123456789012345, -678901234567890, -9223372036854775808, 9223372036854775807],\n    uInt8List = [12, 34, 0, 255],\n    uInt16List = [1234, 5678, 0, 65535],\n    uInt32List = [12345678, 90123456, 0, 4294967295],\n    uInt64List = [1234567890..." /* TRUNCATED STRING LITERAL */
                         ,(String *)&local_240);
  kj::Array<char>::~Array(&local_240);
  kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffe00);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    value_02.builder.dataSize = 0x662308;
    value_02.builder.pointerCount = 0;
    value_02.builder._38_2_ = 0;
    value_02.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffe10._0_8_;
    value_02.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffe10._8_8_;
    value_02.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffe10._16_8_;
    value_02.builder.data = (void *)in_stack_fffffffffffffe10._24_8_;
    value_02.builder.pointers = (WirePointer *)in_stack_fffffffffffffe10._32_8_;
    prettyPrint(value_02);
    kj::StringTree::flatten((String *)&local_240,(StringTree *)&stack0xfffffffffffffe00);
    kj::_::Debug::log<char_const(&)[6138],char_const(&)[5289],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x1d4,ERROR,
               "\"failed: expected \" \"(\\\"( voidField = void,\\\\n\\\" \\\"  boolField = true,\\\\n\\\" \\\"  int8Field = -123,\\\\n\\\" \\\"  int16Field = -12345,\\\\n\\\" \\\"  int32Field = -12345678,\\\\n\\\" \\\"  int64Field = -123456789012345,\\\\n\\\" \\\"  uInt8Field = 234,\\\\n\\\" \\\"  uInt16Field = 45678,\\\\n\\\" \\\"  uInt32Field = 3456789012,\\\\n\\\" \\\"  uInt64Field = 12345678901234567890,\\\\n\\\" \\\"  float32Field = 1234.5,\\\\n\\\" \\\"  float64Field = -1.23e47,\\\\n\\\" \\\"  textField = \\\\\\\"foo\\\\\\\",\\\\n\\\" \\\"  dataField = \\\\\\\"bar\\\\\\\",\\\\n\\\" \\\"  structField = (\\\\n\\\" \\\"    voidField = void,\\\\n\\\" \\\"    boolField = true,\\\\n\\\" \\\"    int8Field = -12,\\\\n\\\" \\\"    int16Field = 3456,\\\\n\\\" \\\"    int32Field = -78901234,\\\\n\\\" \\\"    int64Field = 56789012345678,\\\\n\\\" \\\"    uInt8Field = 90,\\\\n\\\" \\\"    uInt16Field = 1234,\\\\n\\\" \\\"    uInt32Field = 56789012,\\\\n\\\" \\\"    uInt64Field = 345678901234567890,\\\\n\\\" \\\"    float32Field = -1.25e-10,\\\\n\\\" \\\"    float64Field = 345,\\\\n\\\" \\\"    textField = \\\\\\\"baz\\\\\\\",\\\\n\\\" \\\"    dataField = \\\\\\\"qux\\\\\\\",\\\\n\\\" \\\"    structField = (\\\\n\\\" \\\"      voidField = void,\\\\n\\\" \\\"      boolField = false,\\\\n\\\" \\\"      int8Field = 0,\\\\n\\\" \\\"      int16Field = 0,\\\\n\\\" \\\"      int32Field = 0,\\\\n\\\" \\\"      int64Field = 0,\\\\n\\\" \\\"      uInt8Field = 0,\\\\n\\\" \\\"      uInt16Field = 0,\\\\n\\\" \\\"      uInt32Field = 0,\\\\n\\\" \\\"      uInt64Field = 0,\\\\n\\\" \\\"      float32Field = 0,\\\\n\\\" \\\"      float64Field = 0,\\\\n\\\" \\\"      textField = \\\\\\\"nested\\\\\\\",\\\\n\\\" \\\"      structField = (\\\\n\\\" \\\"        voidField = void,\\\\n\\\" \\\"        boolField = false,\\\\n\\\" \\\"        int8Field = 0,\\\\n\\\" \\\"        int16Field = 0,\\\\n\\\" \\\"        int32Field = 0,\\\\n\\\" \\\"        int64Field = 0,\\\\n\\\" \\\"        uInt8Field = 0,\\\\n\\\" \\\"        uInt16Field = 0,\\\\n\\\" \\\"        uInt32Field = 0,\\\\n\\\" \\\"        uInt64Field = 0,\\\\n\\\" \\\"        float32Field = 0,\\\\n\\\" \\\"        float64Field = 0,\\\\n\\\" \\\"        textField = \\\\\\\"really nested\\\\\\\",\\\\n\\\" \\\"        enumField = foo,\\\\n\\\" \\\"        interfaceField = void ),\\\\n\\\" \\\"      enumField = foo,\\\\n\\\" \\\"      interfaceField = void ),\\\\n\\\" \\\"    enumField = baz,\\\\n\\\" \\\"    interfaceFiel..." /* TRUNCATED STRING LITERAL */
               ,(char (*) [6138])
                "failed: expected (\"( voidField = void,\\n\" \"  boolField = true,\\n\" \"  int8Field = -123,\\n\" \"  int16Field = -12345,\\n\" \"  int32Field = -12345678,\\n\" \"  int64Field = -123456789012345,\\n\" \"  uInt8Field = 234,\\n\" \"  uInt16Field = 45678,\\n\" \"  uInt32Field = 3456789012,\\n\" \"  uInt64Field = 12345678901234567890,\\n\" \"  float32Field = 1234.5,\\n\" \"  float64Field = -1.23e47,\\n\" \"  textField = \\\"foo\\\",\\n\" \"  dataField = \\\"bar\\\",\\n\" \"  structField = (\\n\" \"    voidField = void,\\n\" \"    boolField = true,\\n\" \"    int8Field = -12,\\n\" \"    int16Field = 3456,\\n\" \"    int32Field = -78901234,\\n\" \"    int64Field = 56789012345678,\\n\" \"    uInt8Field = 90,\\n\" \"    uInt16Field = 1234,\\n\" \"    uInt32Field = 56789012,\\n\" \"    uInt64Field = 345678901234567890,\\n\" \"    float32Field = -1.25e-10,\\n\" \"    float64Field = 345,\\n\" \"    textField = \\\"baz\\\",\\n\" \"    dataField = \\\"qux\\\",\\n\" \"    structField = (\\n\" \"      voidField = void,\\n\" \"      boolField = false,\\n\" \"      int8Field = 0,\\n\" \"      int16Field = 0,\\n\" \"      int32Field = 0,\\n\" \"      int64Field = 0,\\n\" \"      uInt8Field = 0,\\n\" \"      uInt16Field = 0,\\n\" \"      uInt32Field = 0,\\n\" \"      uInt64Field = 0,\\n\" \"      float32Field = 0,\\n\" \"      float64Field = 0,\\n\" \"      textField = \\\"nested\\\",\\n\" \"      structField = (\\n\" \"        voidField = void,\\n\" \"        boolField = false,\\n\" \"        int8Field = 0,\\n\" \"        int16Field = 0,\\n\" \"        int32Field = 0,\\n\" \"        int64Field = 0,\\n\" \"        uInt8Field = 0,\\n\" \"        uInt16Field = 0,\\n\" \"        uInt32Field = 0,\\n\" \"        uInt64Field = 0,\\n\" \"        float32Field = 0,\\n\" \"        float64Field = 0,\\n\" \"        textField = \\\"really nested\\\",\\n\" \"        enumField = foo,\\n\" \"        interfaceField = void ),\\n\" \"      enumField = foo,\\n\" \"      interfaceField = void ),\\n\" \"    enumField = baz,\\n\" \"    interfaceField = void,\\n\" \"    voidList = [void, void, void],\\n\" \"    boolList = [false, true, false, true, true],\\n\" \"    int8List = [12, -34, -128, 127],\\n\" \"    int16List = [1234, -5678, -32768, 32767],\\n\" \"    int32List = [1..." /* TRUNCATED STRING LITERAL */
               ,(char (*) [5289])
                "( voidField = void,\n  boolField = true,\n  int8Field = -123,\n  int16Field = -12345,\n  int32Field = -12345678,\n  int64Field = -123456789012345,\n  uInt8Field = 234,\n  uInt16Field = 45678,\n  uInt32Field = 3456789012,\n  uInt64Field = 12345678901234567890,\n  float32Field = 1234.5,\n  float64Field = -1.23e47,\n  textField = \"foo\",\n  dataField = \"bar\",\n  structField = (\n    voidField = void,\n    boolField = true,\n    int8Field = -12,\n    int16Field = 3456,\n    int32Field = -78901234,\n    int64Field = 56789012345678,\n    uInt8Field = 90,\n    uInt16Field = 1234,\n    uInt32Field = 56789012,\n    uInt64Field = 345678901234567890,\n    float32Field = -1.25e-10,\n    float64Field = 345,\n    textField = \"baz\",\n    dataField = \"qux\",\n    structField = (\n      voidField = void,\n      boolField = false,\n      int8Field = 0,\n      int16Field = 0,\n      int32Field = 0,\n      int64Field = 0,\n      uInt8Field = 0,\n      uInt16Field = 0,\n      uInt32Field = 0,\n      uInt64Field = 0,\n      float32Field = 0,\n      float64Field = 0,\n      textField = \"nested\",\n      structField = (\n        voidField = void,\n        boolField = false,\n        int8Field = 0,\n        int16Field = 0,\n        int32Field = 0,\n        int64Field = 0,\n        uInt8Field = 0,\n        uInt16Field = 0,\n        uInt32Field = 0,\n        uInt64Field = 0,\n        float32Field = 0,\n        float64Field = 0,\n        textField = \"really nested\",\n        enumField = foo,\n        interfaceField = void ),\n      enumField = foo,\n      interfaceField = void ),\n    enumField = baz,\n    interfaceField = void,\n    voidList = [void, void, void],\n    boolList = [false, true, false, true, true],\n    int8List = [12, -34, -128, 127],\n    int16List = [1234, -5678, -32768, 32767],\n    int32List = [12345678, -90123456, -2147483648, 2147483647],\n    int64List = [123456789012345, -678901234567890, -9223372036854775808, 9223372036854775807],\n    uInt8List = [12, 34, 0, 255],\n    uInt16List = [1234, 5678, 0, 65535],\n    uInt32List = [12345678, 90123456, 0, 4294967295],\n    uInt64List = [1234567890..." /* TRUNCATED STRING LITERAL */
               ,(String *)&local_240);
    kj::Array<char>::~Array(&local_240);
    kj::StringTree::~StringTree((StringTree *)&stack0xfffffffffffffe00);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Stringify, PrettyPrint) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  EXPECT_EQ(
      "( voidField = void,\n"
      "  boolField = false,\n"
      "  int8Field = 0,\n"
      "  int16Field = 0,\n"
      "  int32Field = 0,\n"
      "  int64Field = 0,\n"
      "  uInt8Field = 0,\n"
      "  uInt16Field = 0,\n"
      "  uInt32Field = 0,\n"
      "  uInt64Field = 0,\n"
      "  float32Field = 0,\n"
      "  float64Field = 0,\n"
      "  enumField = foo,\n"
      "  interfaceField = void )", prettyPrint(root).flatten());

  initTestMessage(root);

  EXPECT_EQ(
      "( voidField = void,\n"
      "  boolField = true,\n"
      "  int8Field = -123,\n"
      "  int16Field = -12345,\n"
      "  int32Field = -12345678,\n"
      "  int64Field = -123456789012345,\n"
      "  uInt8Field = 234,\n"
      "  uInt16Field = 45678,\n"
      "  uInt32Field = 3456789012,\n"
      "  uInt64Field = 12345678901234567890,\n"
      "  float32Field = 1234.5,\n"
      "  float64Field = -1.23e47,\n"
      "  textField = \"foo\",\n"
      "  dataField = \"bar\",\n"
      "  structField = (\n"
      "    voidField = void,\n"
      "    boolField = true,\n"
      "    int8Field = -12,\n"
      "    int16Field = 3456,\n"
      "    int32Field = -78901234,\n"
      "    int64Field = 56789012345678,\n"
      "    uInt8Field = 90,\n"
      "    uInt16Field = 1234,\n"
      "    uInt32Field = 56789012,\n"
      "    uInt64Field = 345678901234567890,\n"
      "    float32Field = -1.25e-10,\n"
      "    float64Field = 345,\n"
      "    textField = \"baz\",\n"
      "    dataField = \"qux\",\n"
      "    structField = (\n"
      "      voidField = void,\n"
      "      boolField = false,\n"
      "      int8Field = 0,\n"
      "      int16Field = 0,\n"
      "      int32Field = 0,\n"
      "      int64Field = 0,\n"
      "      uInt8Field = 0,\n"
      "      uInt16Field = 0,\n"
      "      uInt32Field = 0,\n"
      "      uInt64Field = 0,\n"
      "      float32Field = 0,\n"
      "      float64Field = 0,\n"
      "      textField = \"nested\",\n"
      "      structField = (\n"
      "        voidField = void,\n"
      "        boolField = false,\n"
      "        int8Field = 0,\n"
      "        int16Field = 0,\n"
      "        int32Field = 0,\n"
      "        int64Field = 0,\n"
      "        uInt8Field = 0,\n"
      "        uInt16Field = 0,\n"
      "        uInt32Field = 0,\n"
      "        uInt64Field = 0,\n"
      "        float32Field = 0,\n"
      "        float64Field = 0,\n"
      "        textField = \"really nested\",\n"
      "        enumField = foo,\n"
      "        interfaceField = void ),\n"
      "      enumField = foo,\n"
      "      interfaceField = void ),\n"
      "    enumField = baz,\n"
      "    interfaceField = void,\n"
      "    voidList = [void, void, void],\n"
      "    boolList = [false, true, false, true, true],\n"
      "    int8List = [12, -34, -128, 127],\n"
      "    int16List = [1234, -5678, -32768, 32767],\n"
      "    int32List = [12345678, -90123456, -2147483648, 2147483647],\n"
      "    int64List = [123456789012345, -678901234567890, "
                       "-9223372036854775808, 9223372036854775807],\n"
      "    uInt8List = [12, 34, 0, 255],\n"
      "    uInt16List = [1234, 5678, 0, 65535],\n"
      "    uInt32List = [12345678, 90123456, 0, 4294967295],\n"
      "    uInt64List = [123456789012345, 678901234567890, 0, 18446744073709551615],\n"
      "    float32List = [0, 1234567, 1e37, -1e37, 1e-37, -1e-37],\n"
      "    float64List = [0, 123456789012345, 1e306, -1e306, 1e-306, -1e-306],\n"
      "    textList = [\"quux\", \"corge\", \"grault\"],\n"
      "    dataList = [\"garply\", \"waldo\", \"fred\"],\n"
      "    structList = [\n"
      "      ( voidField = void,\n"
      "        boolField = false,\n"
      "        int8Field = 0,\n"
      "        int16Field = 0,\n"
      "        int32Field = 0,\n"
      "        int64Field = 0,\n"
      "        uInt8Field = 0,\n"
      "        uInt16Field = 0,\n"
      "        uInt32Field = 0,\n"
      "        uInt64Field = 0,\n"
      "        float32Field = 0,\n"
      "        float64Field = 0,\n"
      "        textField = \"x structlist 1\",\n"
      "        enumField = foo,\n"
      "        interfaceField = void ),\n"
      "      ( voidField = void,\n"
      "        boolField = false,\n"
      "        int8Field = 0,\n"
      "        int16Field = 0,\n"
      "        int32Field = 0,\n"
      "        int64Field = 0,\n"
      "        uInt8Field = 0,\n"
      "        uInt16Field = 0,\n"
      "        uInt32Field = 0,\n"
      "        uInt64Field = 0,\n"
      "        float32Field = 0,\n"
      "        float64Field = 0,\n"
      "        textField = \"x structlist 2\",\n"
      "        enumField = foo,\n"
      "        interfaceField = void ),\n"
      "      ( voidField = void,\n"
      "        boolField = false,\n"
      "        int8Field = 0,\n"
      "        int16Field = 0,\n"
      "        int32Field = 0,\n"
      "        int64Field = 0,\n"
      "        uInt8Field = 0,\n"
      "        uInt16Field = 0,\n"
      "        uInt32Field = 0,\n"
      "        uInt64Field = 0,\n"
      "        float32Field = 0,\n"
      "        float64Field = 0,\n"
      "        textField = \"x structlist 3\",\n"
      "        enumField = foo,\n"
      "        interfaceField = void ) ],\n"
      "    enumList = [qux, bar, grault] ),\n"
      "  enumField = corge,\n"
      "  interfaceField = void,\n"
      "  voidList = [void, void, void, void, void, void],\n"
      "  boolList = [true, false, false, true],\n"
      "  int8List = [111, -111],\n"
      "  int16List = [11111, -11111],\n"
      "  int32List = [111111111, -111111111],\n"
      "  int64List = [1111111111111111111, -1111111111111111111],\n"
      "  uInt8List = [111, 222],\n"
      "  uInt16List = [33333, 44444],\n"
      "  uInt32List = [3333333333],\n"
      "  uInt64List = [11111111111111111111],\n"
      "  float32List = [5555.5, inf, -inf, nan],\n"
      "  float64List = [7777.75, inf, -inf, nan],\n"
      "  textList = [\"plugh\", \"xyzzy\", \"thud\"],\n"
      "  dataList = [\"oops\", \"exhausted\", \"rfc3092\"],\n"
      "  structList = [\n"
      "    ( voidField = void,\n"
      "      boolField = false,\n"
      "      int8Field = 0,\n"
      "      int16Field = 0,\n"
      "      int32Field = 0,\n"
      "      int64Field = 0,\n"
      "      uInt8Field = 0,\n"
      "      uInt16Field = 0,\n"
      "      uInt32Field = 0,\n"
      "      uInt64Field = 0,\n"
      "      float32Field = 0,\n"
      "      float64Field = 0,\n"
      "      textField = \"structlist 1\",\n"
      "      enumField = foo,\n"
      "      interfaceField = void ),\n"
      "    ( voidField = void,\n"
      "      boolField = false,\n"
      "      int8Field = 0,\n"
      "      int16Field = 0,\n"
      "      int32Field = 0,\n"
      "      int64Field = 0,\n"
      "      uInt8Field = 0,\n"
      "      uInt16Field = 0,\n"
      "      uInt32Field = 0,\n"
      "      uInt64Field = 0,\n"
      "      float32Field = 0,\n"
      "      float64Field = 0,\n"
      "      textField = \"structlist 2\",\n"
      "      enumField = foo,\n"
      "      interfaceField = void ),\n"
      "    ( voidField = void,\n"
      "      boolField = false,\n"
      "      int8Field = 0,\n"
      "      int16Field = 0,\n"
      "      int32Field = 0,\n"
      "      int64Field = 0,\n"
      "      uInt8Field = 0,\n"
      "      uInt16Field = 0,\n"
      "      uInt32Field = 0,\n"
      "      uInt64Field = 0,\n"
      "      float32Field = 0,\n"
      "      float64Field = 0,\n"
      "      textField = \"structlist 3\",\n"
      "      enumField = foo,\n"
      "      interfaceField = void ) ],\n"
      "  enumList = [foo, garply] )",
      prettyPrint(root).flatten());
}